

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteTranslational::IntLoadConstraint_C
          (ChLinkRevoluteTranslational *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp
          ,double recovery_clamp)

{
  long lVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined8 in_XMM1_Qb;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  uVar8 = (ulong)off_L;
  iVar7 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar7 == '\0') {
    return;
  }
  dVar10 = c * this->m_cur_par1;
  if (do_clamp) {
    auVar6._8_8_ = in_XMM1_Qb;
    auVar6._0_8_ = recovery_clamp;
    auVar9._8_8_ = 0x8000000000000000;
    auVar9._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar6,auVar9);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar10;
    auVar9 = vmaxsd_avx(auVar11,auVar9);
    auVar9 = vminsd_avx(auVar9,auVar6);
    dVar10 = auVar9._0_8_;
  }
  auVar18._8_8_ = in_XMM1_Qb;
  auVar18._0_8_ = recovery_clamp;
  dVar12 = c * this->m_cur_par2;
  if (do_clamp) {
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar18,auVar3);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar12;
    auVar9 = vmaxsd_avx(auVar13,auVar9);
    auVar9 = vminsd_avx(auVar9,auVar18);
    dVar12 = auVar9._0_8_;
  }
  dVar14 = c * this->m_cur_dot;
  if (do_clamp) {
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar18,auVar4);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar14;
    auVar9 = vmaxsd_avx(auVar15,auVar9);
    auVar9 = vminsd_avx(auVar9,auVar18);
    dVar14 = auVar9._0_8_;
  }
  dVar16 = (this->m_cur_dist - this->m_dist) * c;
  if (do_clamp) {
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar18,auVar5);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar16;
    auVar9 = vmaxsd_avx(auVar17,auVar9);
    auVar9 = vminsd_avx(auVar9,auVar18);
    dVar16 = auVar9._0_8_;
  }
  lVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar8 < lVar1) {
    pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[uVar8] = dVar10 + pdVar2[uVar8];
    uVar8 = (ulong)(off_L + 1);
    if ((long)uVar8 < lVar1) {
      pdVar2[uVar8] = dVar12 + pdVar2[uVar8];
      uVar8 = (ulong)(off_L + 2);
      if ((long)uVar8 < lVar1) {
        pdVar2[uVar8] = dVar14 + pdVar2[uVar8];
        uVar8 = (ulong)(off_L + 3);
        if ((long)uVar8 < lVar1) {
          pdVar2[uVar8] = dVar16 + pdVar2[uVar8];
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkRevoluteTranslational::IntLoadConstraint_C(const unsigned int off_L,
                                                      ChVectorDynamic<>& Qc,   
                                                      const double c,          
                                                      bool do_clamp,           
                                                      double recovery_clamp    
                                                      ) {
    if (!IsActive())
        return;

    double cnstr_par1_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_par1, -recovery_clamp), recovery_clamp) : c * m_cur_par1;
    double cnstr_par2_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_par2, -recovery_clamp), recovery_clamp) : c * m_cur_par2;
    double cnstr_dot_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_dot, -recovery_clamp), recovery_clamp) : c * m_cur_dot;
    double cnstr_dist_violation =
        do_clamp ? ChMin(ChMax(c * (m_cur_dist - m_dist), -recovery_clamp), recovery_clamp) : c * (m_cur_dist - m_dist);

    Qc(off_L + 0) += cnstr_par1_violation;
    Qc(off_L + 1) += cnstr_par2_violation;
    Qc(off_L + 2) += cnstr_dot_violation;
    Qc(off_L + 3) += cnstr_dist_violation;
}